

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionParseException::OptionParseException(OptionParseException *this,string *message)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  OptionException *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_30,in_RSI);
  OptionException::OptionException(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  *in_RDI = &PTR__OptionParseException_001875b8;
  return;
}

Assistant:

explicit OptionParseException(const std::string& message)
    : OptionException(message)
    {
    }